

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superres_scale.c
# Opt level: O0

void setup_frame_size_from_params(AV1_COMP *cpi,size_params_type *rsz)

{
  undefined4 uVar1;
  undefined4 *in_RSI;
  long in_RDI;
  AV1_COMMON *cm;
  int encode_height;
  int encode_width;
  int in_stack_00000080;
  int in_stack_00000084;
  AV1_COMP *in_stack_00000088;
  int *in_stack_ffffffffffffffd8;
  
  uVar1 = in_RSI[1];
  *(undefined4 *)(in_RDI + 0x3bfc8) = *in_RSI;
  *(undefined4 *)(in_RDI + 0x3bfcc) = uVar1;
  *(undefined1 *)(in_RDI + 0x3bfd0) = *(undefined1 *)(in_RSI + 2);
  av1_calculate_scaled_superres_size((int *)(in_RDI + 0x3bf80),in_stack_ffffffffffffffd8,0);
  av1_set_frame_size(in_stack_00000088,in_stack_00000084,in_stack_00000080);
  return;
}

Assistant:

static void setup_frame_size_from_params(AV1_COMP *cpi,
                                         const size_params_type *rsz) {
  int encode_width = rsz->resize_width;
  int encode_height = rsz->resize_height;

  AV1_COMMON *cm = &cpi->common;
  cm->superres_upscaled_width = encode_width;
  cm->superres_upscaled_height = encode_height;
  cm->superres_scale_denominator = rsz->superres_denom;
  av1_calculate_scaled_superres_size(&encode_width, &encode_height,
                                     rsz->superres_denom);
  av1_set_frame_size(cpi, encode_width, encode_height);
}